

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

void __thiscall
duckdb::MultiFilePushdownInfo::MultiFilePushdownInfo(MultiFilePushdownInfo *this,LogicalGet *get)

{
  pointer pCVar1;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *__x;
  ColumnIndex *col_id;
  pointer pCVar2;
  vector<duckdb::ColumnIndex,_true> *__range1;
  idx_t local_30;
  
  this->table_index = get->table_index;
  this->column_names = &get->names;
  (this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __x = &LogicalGet::GetColumnIds(get)->
         super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>;
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::vector
            (&(this->column_indexes).
              super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>,__x);
  this->extra_info = &get->extra_info;
  pCVar1 = (this->column_indexes).
           super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar2 = (this->column_indexes).
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                _M_impl.super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    local_30 = pCVar2->index;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->column_ids,&local_30)
    ;
  }
  return;
}

Assistant:

MultiFilePushdownInfo::MultiFilePushdownInfo(LogicalGet &get)
    : table_index(get.table_index), column_names(get.names), column_indexes(get.GetColumnIds()),
      extra_info(get.extra_info) {
	for (auto &col_id : column_indexes) {
		column_ids.push_back(col_id.GetPrimaryIndex());
	}
}